

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O1

Node * __thiscall SQASTReader::readNode(SQASTReader *this,TreeOp op)

{
  int iVar1;
  BinExpr *pBVar2;
  DestructuringDecl *pDVar3;
  Expr *pEVar4;
  Chunk *pCVar5;
  ArrayExpr *pAVar6;
  IncExpr *pIVar7;
  TableDecl *pTVar8;
  TryStatement *pTVar9;
  ContinueStatement *pCVar10;
  WhileStatement *pWVar11;
  ForeachStatement *pFVar12;
  BreakStatement *pBVar13;
  Block *pBVar14;
  IfStatement *pIVar15;
  SwitchStatement *pSVar16;
  LiteralExpr *pLVar17;
  ReturnStatement *pRVar18;
  DirectiveStmt *pDVar19;
  DoWhileStatement *pDVar20;
  ForStatement *pFVar21;
  CommaExpr *pCVar22;
  ClassDecl *pCVar23;
  Id *pIVar24;
  CallExpr *pCVar25;
  DeclGroup *pDVar26;
  EnumDecl *pEVar27;
  FunctionDecl *pFVar28;
  GetFieldExpr *pGVar29;
  Node *pNVar30;
  TerExpr *pTVar31;
  ValueDecl *pVVar32;
  ConstDecl *pCVar33;
  undefined **ppuVar34;
  bool bVar35;
  
  pNVar30 = (Node *)0x0;
  switch(op) {
  case TO_BLOCK:
    pBVar14 = readBlock(this,false);
    return (Node *)pBVar14;
  case TO_IF:
    pIVar15 = readIfStatement(this);
    return (Node *)pIVar15;
  case TO_WHILE:
    pWVar11 = readWhileStatement(this);
    return (Node *)pWVar11;
  case TO_DOWHILE:
    pDVar20 = readDoWhileStatement(this);
    return (Node *)pDVar20;
  case TO_FOR:
    pFVar21 = readForStatement(this);
    return (Node *)pFVar21;
  case TO_FOREACH:
    pFVar12 = readForeachStatement(this);
    return (Node *)pFVar12;
  case TO_SWITCH:
    pSVar16 = readSwitchStatement(this);
    return (Node *)pSVar16;
  case TO_RETURN:
    pRVar18 = readReturnStatement(this);
    return (Node *)pRVar18;
  case TO_YIELD:
    pEVar4 = readNullableExpression(this);
    pNVar30 = (Node *)newNode<SQCompilation::YieldStatement,SQCompilation::Expr*>(this,pEVar4);
    return pNVar30;
  case TO_THROW:
    pEVar4 = readNullableExpression(this);
    pNVar30 = (Node *)newNode<SQCompilation::ThrowStatement,SQCompilation::Expr*>(this,pEVar4);
    return pNVar30;
  case TO_TRY:
    pTVar9 = readTryStatement(this);
    return (Node *)pTVar9;
  case TO_BREAK:
    pBVar13 = readBreakStatement(this);
    return (Node *)pBVar13;
  case TO_CONTINUE:
    pCVar10 = readContinueStatement(this);
    return (Node *)pCVar10;
  case TO_EXPR_STMT:
    pEVar4 = readExpression(this);
    pCVar5 = Arena::findChunk(this->astArena,0x28);
    pNVar30 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)&pNVar30[1]._coordinates;
    pNVar30->_op = TO_EXPR_STMT;
    (pNVar30->_coordinates).lineStart = -1;
    (pNVar30->_coordinates).columnStart = -1;
    (pNVar30->_coordinates).lineEnd = -1;
    (pNVar30->_coordinates).columnEnd = -1;
    ppuVar34 = &PTR__ArenaObj_001a48c8;
    goto LAB_0012c63a;
  case TO_EMPTY:
    pCVar5 = Arena::findChunk(this->astArena,0x20);
    pNVar30 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)(pNVar30 + 1);
    pNVar30->_op = TO_EMPTY;
    (pNVar30->_coordinates).lineStart = -1;
    (pNVar30->_coordinates).columnStart = -1;
    (pNVar30->_coordinates).lineEnd = -1;
    (pNVar30->_coordinates).columnEnd = -1;
    ppuVar34 = &PTR__ArenaObj_001a4890;
    break;
  case TO_DIRECTIVE:
    pDVar19 = readDirectiveStmt(this);
    return (Node *)pDVar19;
  default:
    goto switchD_0012c514_caseD_10;
  case TO_ID:
    pIVar24 = readId(this);
    return (Node *)pIVar24;
  case TO_COMMA:
    pCVar22 = readCommaExpr(this);
    return (Node *)pCVar22;
  case TO_NULLC:
  case TO_ASSIGN:
  case TO_OROR:
  case TO_ANDAND:
  case TO_OR:
  case TO_XOR:
  case TO_AND:
  case TO_NE:
  case TO_EQ:
  case TO_3CMP:
  case TO_GE:
  case TO_GT:
  case TO_LE:
  case TO_LT:
  case TO_IN:
  case TO_INSTANCEOF:
  case TO_USHR:
  case TO_SHR:
  case TO_SHL:
  case TO_MUL:
  case TO_DIV:
  case TO_MOD:
  case TO_ADD:
  case TO_SUB:
  case TO_NEWSLOT:
  case TO_PLUSEQ:
  case TO_MINUSEQ:
  case TO_MULEQ:
  case TO_DIVEQ:
  case TO_MODEQ:
    pBVar2 = readBinExpr(this,op);
    return (Node *)pBVar2;
  case TO_NOT:
  case TO_BNOT:
  case TO_NEG:
  case TO_TYPEOF:
  case TO_RESUME:
  case TO_CLONE:
  case TO_PAREN:
  case TO_DELETE:
    pEVar4 = readExpression(this);
    pCVar5 = Arena::findChunk(this->astArena,0x28);
    pNVar30 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)&pNVar30[1]._coordinates;
    pNVar30->_op = op;
    (pNVar30->_coordinates).lineStart = -1;
    (pNVar30->_coordinates).columnStart = -1;
    (pNVar30->_coordinates).lineEnd = -1;
    (pNVar30->_coordinates).columnEnd = -1;
    (pNVar30->super_ArenaObj)._vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a4988;
    pNVar30[1].super_ArenaObj._vptr_ArenaObj = (_func_int **)pEVar4;
    iVar1 = (pEVar4->super_Node)._coordinates.columnEnd;
    (pNVar30->_coordinates).lineEnd = (pEVar4->super_Node)._coordinates.lineEnd;
    (pNVar30->_coordinates).columnEnd = iVar1;
    return pNVar30;
  case TO_LITERAL:
    pLVar17 = readLiteral(this);
    return (Node *)pLVar17;
  case TO_BASE:
    pCVar5 = Arena::findChunk(this->astArena,0x20);
    pNVar30 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)(pNVar30 + 1);
    pNVar30->_op = TO_BASE;
    (pNVar30->_coordinates).lineStart = -1;
    (pNVar30->_coordinates).columnStart = -1;
    (pNVar30->_coordinates).lineEnd = -1;
    (pNVar30->_coordinates).columnEnd = -1;
    ppuVar34 = &PTR__ArenaObj_001a4a30;
    break;
  case TO_ROOT_TABLE_ACCESS:
    pCVar5 = Arena::findChunk(this->astArena,0x20);
    pNVar30 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)(pNVar30 + 1);
    pNVar30->_op = TO_ROOT_TABLE_ACCESS;
    (pNVar30->_coordinates).lineStart = -1;
    (pNVar30->_coordinates).columnStart = -1;
    (pNVar30->_coordinates).lineEnd = -1;
    (pNVar30->_coordinates).columnEnd = -1;
    ppuVar34 = &PTR__ArenaObj_001a4a68;
    break;
  case TO_INC:
    pIVar7 = readIncExpr(this);
    return (Node *)pIVar7;
  case TO_DECL_EXPR:
    pEVar4 = (Expr *)readDeclaration(this);
    pCVar5 = Arena::findChunk(this->astArena,0x28);
    pNVar30 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)&pNVar30[1]._coordinates;
    pNVar30->_op = TO_DECL_EXPR;
    (pNVar30->_coordinates).lineStart = -1;
    (pNVar30->_coordinates).columnStart = -1;
    (pNVar30->_coordinates).lineEnd = -1;
    (pNVar30->_coordinates).columnEnd = -1;
    ppuVar34 = &PTR__ArenaObj_001a4b10;
LAB_0012c63a:
    (pNVar30->super_ArenaObj)._vptr_ArenaObj = (_func_int **)ppuVar34;
    pNVar30[1].super_ArenaObj._vptr_ArenaObj = (_func_int **)pEVar4;
    return pNVar30;
  case TO_ARRAYEXPR:
    pAVar6 = readArrayExpr(this);
    return (Node *)pAVar6;
  case TO_GETFIELD:
    pGVar29 = readGetFieldExpr(this);
    return (Node *)pGVar29;
  case TO_GETSLOT:
    pNVar30 = (Node *)readGetSlotExpr(this);
    return pNVar30;
  case TO_CALL:
    pCVar25 = readCallExpr(this);
    return (Node *)pCVar25;
  case TO_TERNARY:
    pTVar31 = readTernaryExpr(this);
    return (Node *)pTVar31;
  case TO_VAR:
    bVar35 = true;
    goto LAB_0012c839;
  case TO_PARAM:
    bVar35 = false;
LAB_0012c839:
    pVVar32 = readValueDecl(this,bVar35);
    return (Node *)pVVar32;
  case TO_CONST:
    pCVar33 = readConstDecl(this);
    return (Node *)pCVar33;
  case TO_DECL_GROUP:
    pDVar26 = readDeclGroup(this);
    return (Node *)pDVar26;
  case TO_DESTRUCTURE:
    pDVar3 = readDestructuringDecl(this);
    return (Node *)pDVar3;
  case TO_FUNCTION:
    bVar35 = false;
    goto LAB_0012c797;
  case TO_CONSTRUCTOR:
    bVar35 = true;
LAB_0012c797:
    pFVar28 = readFunctionDecl(this,bVar35);
    return (Node *)pFVar28;
  case TO_CLASS:
    pCVar23 = readClassDecl(this);
    return (Node *)pCVar23;
  case TO_ENUM:
    pEVar27 = readEnumDecl(this);
    return (Node *)pEVar27;
  case TO_TABLE:
    pTVar8 = readTableDecl(this);
    return (Node *)pTVar8;
  }
  (pNVar30->super_ArenaObj)._vptr_ArenaObj = (_func_int **)ppuVar34;
switchD_0012c514_caseD_10:
  return pNVar30;
}

Assistant:

Node *SQASTReader::readNode(enum TreeOp op) {
  switch (op)
  {
  case TO_BLOCK: return readBlock(false);
  case TO_IF: return readIfStatement();
  case TO_WHILE: return readWhileStatement();
  case TO_DOWHILE: return readDoWhileStatement();
  case TO_FOR: return readForStatement();
  case TO_FOREACH: return readForeachStatement();
  case TO_SWITCH: return readSwitchStatement();
  case TO_RETURN: return readReturnStatement();
  case TO_YIELD: return readYieldStatement();
  case TO_THROW: return readThrowStatement();
  case TO_TRY: return readTryStatement();
  case TO_BREAK: return readBreakStatement();
  case TO_CONTINUE: return readContinueStatement();
  case TO_EXPR_STMT: return readExprStatement();
  case TO_EMPTY: return readEmptyStatement();
  // case TO_STATEMENT_MARK:
  case TO_ID: return readId();
  case TO_COMMA: return readCommaExpr();
  case TO_NULLC:
  case TO_ASSIGN:
  case TO_OROR:
  case TO_ANDAND:
  case TO_OR:
  case TO_XOR:
  case TO_AND:
  case TO_NE:
  case TO_EQ:
  case TO_3CMP:
  case TO_GE:
  case TO_GT:
  case TO_LE:
  case TO_LT:
  case TO_IN:
  case TO_INSTANCEOF:
  case TO_USHR:
  case TO_SHR:
  case TO_SHL:
  case TO_MUL:
  case TO_DIV:
  case TO_MOD:
  case TO_ADD:
  case TO_SUB:
  case TO_NEWSLOT:
  case TO_PLUSEQ:
  case TO_MINUSEQ:
  case TO_MULEQ:
  case TO_DIVEQ:
  case TO_MODEQ:
    return readBinExpr(op);
  case TO_NOT:
  case TO_BNOT:
  case TO_NEG:
  case TO_TYPEOF:
  case TO_RESUME:
  case TO_CLONE:
  case TO_PAREN:
  case TO_DELETE:
    return readUnaryExpr(op);
  case TO_LITERAL: return readLiteral();
  case TO_BASE: return readBaseExpr();
  case TO_ROOT_TABLE_ACCESS: return readRootTableAccessExpr();
  case TO_INC: return readIncExpr();
  case TO_DECL_EXPR: return readDeclExpr();
  case TO_ARRAYEXPR: return readArrayExpr();
  case TO_GETFIELD: return readGetFieldExpr();
  case TO_GETSLOT: return readGetSlotExpr();
  case TO_CALL: return readCallExpr();
  case TO_TERNARY: return readTernaryExpr();
  // case TO_EXPR_MARK:
  case TO_VAR: return readValueDecl(true);
  case TO_PARAM: return readValueDecl(false);
  case TO_CONST: return readConstDecl();
  case TO_DECL_GROUP: return readDeclGroup();
  case TO_DESTRUCTURE: return readDestructuringDecl();
  case TO_FUNCTION: return readFunctionDecl(false);
  case TO_CONSTRUCTOR: return readFunctionDecl(true);
  case TO_CLASS: return readClassDecl();
  case TO_ENUM: return readEnumDecl();
  case TO_TABLE: return readTableDecl();
  case TO_DIRECTIVE: return readDirectiveStmt();
  default:
    assert("Unknown Tree code");
    return NULL;
  }
}